

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::StandardCaseItemSyntax::setChild
          (StandardCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar9;
  logic_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar9 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar9 = *ppSVar6;
    }
    if (pSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::SyntaxNode *>::not_null(U &&) [T = slang::syntax::SyntaxNode *, U = slang::syntax::SyntaxNode *]"
                );
    }
    (this->clause).ptr = pSVar9;
  }
  else if (index == 1) {
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->colon).kind = pvVar8->kind;
    (this->colon).field_0x2 = uVar3;
    (this->colon).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->colon).rawLen = uVar5;
    (this->colon).info = pIVar2;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar10;
      psVar11 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar10[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x2f2a);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar10;
      plVar12 = plVar10 + 2;
      if (local_b0 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar12;
      }
      local_a8 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar10;
      plVar12 = plVar10 + 2;
      if (local_f0 == plVar12) {
        local_e0 = *plVar12;
        lStack_d8 = plVar10[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar12;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar7 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (*ppSVar6);
    (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->expressions).super_SyntaxListBase.childCount = (pSVar7->super_SyntaxListBase).childCount;
    sVar1 = (pSVar7->elements).size_;
    (this->expressions).elements.data_ = (pSVar7->elements).data_;
    (this->expressions).elements.size_ = sVar1;
  }
  return;
}

Assistant:

void StandardCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: clause = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}